

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

void __thiscall notch::io::LayerSpec::LayerSpec(LayerSpec *this,ABackpropLayer *layer)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  invalid_argument *this_00;
  bool bVar3;
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  string tag;
  
  (this->tag)._M_dataplus._M_p = (pointer)&(this->tag).field_2;
  (this->tag)._M_string_length = 0;
  (this->tag).field_2._M_local_buf[0] = '\0';
  this->inputDim = 0;
  this->outputDim = 0;
  (this->activation).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->activation).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (**layer->_vptr_ABackpropLayer)(&tag);
  std::__cxx11::string::_M_assign((string *)this);
  iVar2 = (*layer->_vptr_ABackpropLayer[1])(layer);
  this->inputDim = CONCAT44(extraout_var,iVar2);
  iVar2 = (*layer->_vptr_ABackpropLayer[2])(layer);
  this->outputDim = CONCAT44(extraout_var_00,iVar2);
  (*layer->_vptr_ABackpropLayer[6])(local_60,layer);
  if (local_60._0_8_ == 0) {
    bVar3 = false;
  }
  else {
    (*layer->_vptr_ABackpropLayer[7])(local_70,layer);
    bVar3 = (pointer)local_70._0_8_ != (pointer)0x0;
    core::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  }
  core::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  bVar1 = std::operator==(&tag,"ActivationLayer");
  if (bVar3) {
    iVar2 = (*layer->_vptr_ABackpropLayer[10])(layer);
    (*(code *)**(undefined8 **)CONCAT44(extraout_var_01,iVar2))
              (local_60,(undefined8 *)CONCAT44(extraout_var_01,iVar2));
    std::make_shared<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    core::std::
    __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&(this->activation).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ,(__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)local_70);
    core::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    std::__cxx11::string::~string((string *)local_60);
    (*layer->_vptr_ABackpropLayer[6])(local_70,layer);
    std::make_shared<std::valarray<float>,std::valarray<float>const&>((valarray<float> *)local_60);
    core::std::__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>
               ,(__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2> *)local_60);
    core::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    core::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    (*layer->_vptr_ABackpropLayer[7])(local_70,layer);
    std::make_shared<std::valarray<float>,std::valarray<float>const&>((valarray<float> *)local_60);
    core::std::__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2> *)local_60);
    core::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    core::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  }
  else {
    if (!bVar1) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "unsupported layer type: ",&tag);
      std::invalid_argument::invalid_argument(this_00,(string *)local_60);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar2 = (*layer->_vptr_ABackpropLayer[10])(layer);
    (*(code *)**(undefined8 **)CONCAT44(extraout_var_02,iVar2))
              (local_60,(undefined8 *)CONCAT44(extraout_var_02,iVar2));
    std::make_shared<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    core::std::
    __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&(this->activation).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ,(__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)local_70);
    core::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    std::__cxx11::string::~string((string *)local_60);
  }
  std::__cxx11::string::~string((string *)&tag);
  return;
}

Assistant:

LayerSpec(const ABackpropLayer &layer) {
        std::string tag = layer.tag();
        this->tag = tag;
        this->inputDim = layer.inputDim();
        this->outputDim = layer.outputDim();
        // TODO: implement LayerSpec for layers with only weights or bias
        bool hasParameters = layer.getWeights() && layer.getBias();
        bool hasActivation = tag == "ActivationLayer";
        if (hasParameters) {
            auto &af = layer.getActivation();
            activation = std::make_shared<std::string>(af.tag());
            weights = std::make_shared<Array>(*layer.getWeights());
            bias = std::make_shared<Array>(*layer.getBias());
        } else if (hasActivation) {
            auto &af = layer.getActivation();
            activation = std::make_shared<std::string>(af.tag());
        } else {
            throw std::invalid_argument("unsupported layer type: " + tag);
        }
    }